

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRandomShaderTests.cpp
# Opt level: O2

RandomShaderCase *
deqp::gles3::Functional::anon_unknown_1::createRandomShaderCase
          (Context *context,char *description,ProgramParameters *baseParams,deUint32 seed,
          bool vertex,bool fragment)

{
  TestContext *testCtx;
  RenderContext *renderCtx;
  RandomShaderCase *this;
  long lVar1;
  ProgramParameters *pPVar2;
  deUint32 seed_local;
  string local_b0;
  ProgramParameters params;
  
  pPVar2 = &params;
  for (lVar1 = 0x1a; lVar1 != 0; lVar1 = lVar1 + -1) {
    pPVar2->seed = baseParams->seed;
    baseParams = (ProgramParameters *)&baseParams->version;
    pPVar2 = (ProgramParameters *)&pPVar2->version;
  }
  params.version = VERSION_300;
  seed_local = seed;
  params.seed = seed;
  params.vertexParameters.randomize = vertex;
  params.fragmentParameters.randomize = fragment;
  this = (RandomShaderCase *)operator_new(0x4d0);
  testCtx = context->m_testCtx;
  renderCtx = context->m_renderCtx;
  de::toString<unsigned_int>(&local_b0,&seed_local);
  deqp::gls::RandomShaderCase::RandomShaderCase
            (this,testCtx,renderCtx,local_b0._M_dataplus._M_p,description,&params);
  std::__cxx11::string::~string((string *)&local_b0);
  return this;
}

Assistant:

gls::RandomShaderCase* createRandomShaderCase (Context& context, const char* description, const rsg::ProgramParameters& baseParams, deUint32 seed, bool vertex, bool fragment)
{
	rsg::ProgramParameters params = baseParams;

	params.version						= rsg::VERSION_300;
	params.seed							= seed;
	params.vertexParameters.randomize	= vertex;
	params.fragmentParameters.randomize	= fragment;

	return new gls::RandomShaderCase(context.getTestContext(), context.getRenderContext(), de::toString(seed).c_str(), description, params);
}